

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::writeLocalModel(Highs *this,HighsModel *model,string *filename)

{
  HighsSparseMatrix *this_00;
  HighsLogOptions *log_options;
  pointer pcVar1;
  HighsOptions *pHVar2;
  string *psVar3;
  bool bVar4;
  HighsStatus HVar5;
  Filereader *pFVar6;
  char *format;
  allocator local_129;
  Filereader *local_128;
  HighsOptions *local_120;
  string *local_118;
  string local_110;
  string local_f0 [32];
  string local_d0;
  string local_b0;
  HighsLogOptions local_90;
  
  local_118 = filename;
  HighsLp::setMatrixDimensions(&model->lp_);
  this_00 = &(model->lp_).a_matrix_;
  HighsSparseMatrix::ensureColwise(this_00);
  std::__cxx11::string::string((string *)&local_d0,"writeLocalModel",(allocator *)&local_110);
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  bVar4 = lpDimensionsOk(&local_d0,&model->lp_,log_options);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar4) {
    return kError;
  }
  if ((0 < (model->hessian_).dim_) &&
     (HVar5 = assessHessianDimensions(&this->options_,&model->hessian_), HVar5 == kError)) {
    return kError;
  }
  HVar5 = HighsSparseMatrix::assessStart(this_00,log_options);
  if (HVar5 == kError) {
    return kError;
  }
  HVar5 = HighsSparseMatrix::assessIndexBounds(this_00,log_options);
  if (HVar5 == kError) {
    return kError;
  }
  bVar4 = HighsNameHash::hasDuplicate(&(model->lp_).col_hash_,&(model->lp_).col_names_);
  if (bVar4) {
    format = "Model has repeated column names\n";
  }
  else {
    bVar4 = HighsNameHash::hasDuplicate(&(model->lp_).row_hash_,&(model->lp_).row_names_);
    psVar3 = local_118;
    if (!bVar4) {
      bVar4 = std::operator==(local_118,"");
      if (bVar4) {
        reportModel(this,model);
        HVar5 = kOk;
      }
      else {
        local_120 = &this->options_;
        std::__cxx11::string::string((string *)&local_b0,(string *)psVar3);
        pFVar6 = Filereader::getFilereader(log_options,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        pHVar2 = local_120;
        pcVar1 = (psVar3->_M_dataplus)._M_p;
        local_128 = pFVar6;
        if (pFVar6 == (Filereader *)0x0) {
          highsLogUser(log_options,kError,"Model file %s not supported\n",pcVar1);
          return kError;
        }
        highsLogUser(log_options,kInfo,"Writing the model to %s\n",pcVar1);
        HighsLogOptions::HighsLogOptions(&local_90,log_options);
        std::__cxx11::string::string(local_f0,(string *)psVar3);
        HVar5 = (*local_128->_vptr_Filereader[1])(local_128,pHVar2,local_f0,model);
        std::__cxx11::string::string((string *)&local_110,"writeModelToFile",&local_129);
        HVar5 = interpretCallStatus(&local_90,HVar5,kOk,&local_110);
        pFVar6 = local_128;
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string(local_f0);
        std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
        (*pFVar6->_vptr_Filereader[3])(pFVar6);
      }
      goto LAB_0023278b;
    }
    format = "Model has repeated row names\n";
  }
  highsLogUser(log_options,kError,format);
  HVar5 = kError;
LAB_0023278b:
  HVar5 = returnFromHighs(this,HVar5);
  return HVar5;
}

Assistant:

HighsStatus Highs::writeLocalModel(HighsModel& model,
                                   const std::string& filename) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;

  HighsLp& lp = model.lp_;
  // Dimensions in a_matrix_ may not be set, so take them from lp
  lp.setMatrixDimensions();

  // Ensure that the LP is column-wise
  lp.ensureColwise();

  // Ensure that the dimensions are OK
  if (!lpDimensionsOk("writeLocalModel", lp, options_.log_options))
    return HighsStatus::kError;

  if (model.hessian_.dim_ > 0) {
    call_status = assessHessianDimensions(options_, model.hessian_);
    if (call_status == HighsStatus::kError) return call_status;
  }

  // Check that the matrix starts are OK
  call_status = lp.a_matrix_.assessStart(options_.log_options);
  if (call_status == HighsStatus::kError) return call_status;

  // Check that the matrix indices are within bounds
  call_status = lp.a_matrix_.assessIndexBounds(options_.log_options);
  if (call_status == HighsStatus::kError) return call_status;

  // Check for repeated column or row names that would corrupt the file
  if (model.lp_.col_hash_.hasDuplicate(model.lp_.col_names_)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has repeated column names\n");
    return returnFromHighs(HighsStatus::kError);
  }
  if (model.lp_.row_hash_.hasDuplicate(model.lp_.row_names_)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has repeated row names\n");
    return returnFromHighs(HighsStatus::kError);
  }
  if (filename == "") {
    // Empty file name: report model on logging stream
    reportModel(model);
    return_status = HighsStatus::kOk;
  } else {
    Filereader* writer =
        Filereader::getFilereader(options_.log_options, filename);
    if (writer == NULL) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Model file %s not supported\n", filename.c_str());
      return HighsStatus::kError;
    }
    // Report to user that model is being written
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the model to %s\n", filename.c_str());
    return_status =
        interpretCallStatus(options_.log_options,
                            writer->writeModelToFile(options_, filename, model),
                            return_status, "writeModelToFile");
    delete writer;
  }
  return returnFromHighs(return_status);
}